

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

int fl_wait(double time_to_wait)

{
  int iVar1;
  ulong uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ushort uVar9;
  fd_set *pfVar10;
  fd_set *pfVar11;
  fd_set *pfVar12;
  timeval *__timeout;
  bool bVar13;
  byte bVar14;
  timeval t;
  fd_set fdt [3];
  
  bVar14 = 0;
  if ((fl_display != (Display *)0x0) && (iVar4 = XQLength(), iVar4 != 0)) {
    do_queued_events();
    return 1;
  }
  lVar8 = 0x10;
  pfVar10 = fdsets;
  pfVar11 = fdt;
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    pfVar11->fds_bits[0] = pfVar10->fds_bits[0];
    pfVar10 = (fd_set *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar11 = (fd_set *)((long)pfVar11 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pfVar10 = fdsets + 1;
  pfVar12 = (fd_set *)(fdt + 1);
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    pfVar12->fds_bits[0] = pfVar10->fds_bits[0];
    pfVar10 = (fd_set *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar12 = (fd_set *)((long)pfVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  pfVar10 = fdsets + 2;
  pfVar12 = (fd_set *)(fdt + 2);
  for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
    pfVar12->fds_bits[0] = pfVar10->fds_bits[0];
    pfVar10 = (fd_set *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
    pfVar12 = (fd_set *)((long)pfVar12 + ((ulong)bVar14 * -2 + 1) * 8);
  }
  (*fl_unlock_function)();
  if (2147483.648 <= time_to_wait) {
    __timeout = (timeval *)0x0;
  }
  else {
    t.tv_sec = (__time_t)(int)time_to_wait;
    __timeout = &t;
    t.tv_usec = (__suseconds_t)(int)((time_to_wait - (double)(int)time_to_wait) * 1000000.0);
  }
  iVar4 = select(maxfd + 1,(fd_set *)fdt,(fd_set *)(fdt + 1),(fd_set *)(fdt + 2),
                 (timeval *)__timeout);
  (*fl_lock_function)();
  if (0 < iVar4) {
    iVar6 = nfds;
    for (lVar7 = 0; lVar7 < iVar6; lVar7 = lVar7 + 1) {
      iVar1 = *(int *)((long)fd + lVar8 + -0x10);
      iVar5 = iVar1 / 0x40;
      uVar2 = (long)iVar1 % 0x40;
      bVar13 = ((ulong)fdt[0].fds_bits[iVar5] >> (uVar2 & 0x3f) & 1) != 0;
      uVar9 = bVar13 + 4;
      if (((ulong)fdt[1].fds_bits[iVar5] >> (uVar2 & 0x3f) & 1) == 0) {
        uVar9 = (ushort)bVar13;
      }
      uVar3 = uVar9 + 8;
      if (((ulong)fdt[2].fds_bits[iVar5] >> (uVar2 & 0x3f) & 1) == 0) {
        uVar3 = uVar9;
      }
      if ((*(ushort *)((long)fd + lVar8 + -0xc) & uVar3) != 0) {
        (**(code **)((long)fd + lVar8 + -8))(iVar1,*(undefined8 *)((long)&fd->fd + lVar8));
        iVar6 = nfds;
      }
      lVar8 = lVar8 + 0x18;
    }
  }
  return iVar4;
}

Assistant:

int fl_wait(double time_to_wait) {

  // OpenGL and other broken libraries call XEventsQueued
  // unnecessarily and thus cause the file descriptor to not be ready,
  // so we must check for already-read events:
  if (fl_display && XQLength(fl_display)) {do_queued_events(); return 1;}

#  if !USE_POLL
  fd_set fdt[3];
  fdt[0] = fdsets[0];
  fdt[1] = fdsets[1];
  fdt[2] = fdsets[2];
#  endif
  int n;

  fl_unlock_function();

  if (time_to_wait < 2147483.648) {
#  if USE_POLL
    n = ::poll(pollfds, nfds, int(time_to_wait*1000 + .5));
#  else
    timeval t;
    t.tv_sec = int(time_to_wait);
    t.tv_usec = int(1000000 * (time_to_wait-t.tv_sec));
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],&t);
#  endif
  } else {
#  if USE_POLL
    n = ::poll(pollfds, nfds, -1);
#  else
    n = ::select(maxfd+1,&fdt[0],&fdt[1],&fdt[2],0);
#  endif
  }

  fl_lock_function();

  if (n > 0) {
    for (int i=0; i<nfds; i++) {
#  if USE_POLL
      if (pollfds[i].revents) fd[i].cb(pollfds[i].fd, fd[i].arg);
#  else
      int f = fd[i].fd;
      short revents = 0;
      if (FD_ISSET(f,&fdt[0])) revents |= POLLIN;
      if (FD_ISSET(f,&fdt[1])) revents |= POLLOUT;
      if (FD_ISSET(f,&fdt[2])) revents |= POLLERR;
      if (fd[i].events & revents) fd[i].cb(f, fd[i].arg);
#  endif
    }
  }
  return n;
}